

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve64_CP32_SHA256.c
# Opt level: O1

uint32_t Hacl_HPKE_Curve64_CP32_SHA256_openBase
                   (uint8_t *pkE,uint8_t *skR,uint32_t infolen,uint8_t *info,uint32_t aadlen,
                   uint8_t *aad,uint32_t ctlen,uint8_t *ct,uint8_t *o_pt)

{
  Hacl_Impl_HPKE_context_s o_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t ctx_nonce [12];
  uint64_t ctx_seq;
  Hacl_Impl_HPKE_context_s o_ctx;
  uint8_t nonce [12];
  uint8_t ctx_key [32];
  uint8_t ctx_exporter [32];
  undefined8 local_a0;
  undefined4 local_98;
  long local_90;
  uint8_t *local_88;
  undefined8 *puStack_80;
  long *local_78;
  uint8_t *puStack_70;
  undefined8 local_68;
  byte local_60;
  byte bStack_5f;
  byte bStack_5e;
  byte bStack_5d;
  uint8_t local_58 [72];
  
  local_88 = local_58;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  puStack_80 = &local_a0;
  local_a0 = 0;
  local_98 = 0;
  local_78 = &local_90;
  local_90 = 0;
  puStack_70 = local_58 + 0x20;
  local_58[0x30] = '\0';
  local_58[0x31] = '\0';
  local_58[0x32] = '\0';
  local_58[0x33] = '\0';
  local_58[0x34] = '\0';
  local_58[0x35] = '\0';
  local_58[0x36] = '\0';
  local_58[0x37] = '\0';
  local_58[0x38] = '\0';
  local_58[0x39] = '\0';
  local_58[0x3a] = '\0';
  local_58[0x3b] = '\0';
  local_58[0x3c] = '\0';
  local_58[0x3d] = '\0';
  local_58[0x3e] = '\0';
  local_58[0x3f] = '\0';
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  local_58[0x22] = '\0';
  local_58[0x23] = '\0';
  local_58[0x24] = '\0';
  local_58[0x25] = '\0';
  local_58[0x26] = '\0';
  local_58[0x27] = '\0';
  local_58[0x28] = '\0';
  local_58[0x29] = '\0';
  local_58[0x2a] = '\0';
  local_58[0x2b] = '\0';
  local_58[0x2c] = '\0';
  local_58[0x2d] = '\0';
  local_58[0x2e] = '\0';
  local_58[0x2f] = '\0';
  o_ctx_00.ctx_nonce = (uint8_t *)puStack_80;
  o_ctx_00.ctx_key = local_88;
  o_ctx_00.ctx_seq = (uint64_t *)local_78;
  o_ctx_00.ctx_exporter = puStack_70;
  uVar1 = Hacl_HPKE_Curve64_CP32_SHA256_setupBaseR(o_ctx_00,pkE,skR,infolen,info);
  uVar2 = 1;
  if (uVar1 == 0) {
    local_68 = CONCAT17((byte)((ulong)local_90 >> 0x20) ^ local_a0._7_1_,
                        CONCAT16((byte)((ulong)local_90 >> 0x28) ^ local_a0._6_1_,
                                 CONCAT15((byte)((ulong)local_90 >> 0x30) ^ local_a0._5_1_,
                                          CONCAT14(local_a0._4_1_ ^ (byte)((ulong)local_90 >> 0x38),
                                                   (int)local_a0))));
    _local_60 = CONCAT13((byte)local_90 ^ local_98._3_1_,
                         CONCAT12((byte)((ulong)local_90 >> 8) ^ local_98._2_1_,
                                  CONCAT11((byte)((ulong)local_90 >> 0x10) ^ local_98._1_1_,
                                           (byte)((ulong)local_90 >> 0x18) ^ (byte)local_98)));
    uVar1 = Hacl_AEAD_Chacha20Poly1305_decrypt
                      (o_pt,ct,ctlen - 0x10,aad,aadlen,local_58,(uint8_t *)&local_68,
                       ct + ((ulong)ctlen - 0x10));
    uVar2 = 1;
    if ((uVar1 == 0) && (local_90 != -1)) {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

uint32_t
Hacl_HPKE_Curve64_CP32_SHA256_openBase(
  uint8_t *pkE,
  uint8_t *skR,
  uint32_t infolen,
  uint8_t *info,
  uint32_t aadlen,
  uint8_t *aad,
  uint32_t ctlen,
  uint8_t *ct,
  uint8_t *o_pt
)
{
  uint8_t ctx_key[32U] = { 0U };
  uint8_t ctx_nonce[12U] = { 0U };
  uint64_t ctx_seq = 0ULL;
  uint8_t ctx_exporter[32U] = { 0U };
  Hacl_Impl_HPKE_context_s
  o_ctx =
    {
      .ctx_key = ctx_key,
      .ctx_nonce = ctx_nonce,
      .ctx_seq = &ctx_seq,
      .ctx_exporter = ctx_exporter
    };
  uint32_t res = Hacl_HPKE_Curve64_CP32_SHA256_setupBaseR(o_ctx, pkE, skR, infolen, info);
  if (res == 0U)
  {
    uint8_t nonce[12U] = { 0U };
    uint64_t s = o_ctx.ctx_seq[0U];
    uint8_t enc[12U] = { 0U };
    store64_be(enc + 4U, s);
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint8_t xi = enc[i];
      uint8_t yi = o_ctx.ctx_nonce[i];
      nonce[i] = (uint32_t)xi ^ (uint32_t)yi;);
    uint8_t *cipher = ct;
    uint8_t *tag = ct + ctlen - 16U;
    uint32_t
    res1 =
      Hacl_AEAD_Chacha20Poly1305_decrypt(o_pt,
        cipher,
        ctlen - 16U,
        aad,
        aadlen,
        o_ctx.ctx_key,
        nonce,
        tag);
    if (res1 == 0U)
    {
      uint64_t s1 = o_ctx.ctx_seq[0U];
      if (s1 == 18446744073709551615ULL)
      {
        return 1U;
      }
      uint64_t s_ = s1 + 1ULL;
      o_ctx.ctx_seq[0U] = s_;
      return 0U;
    }
    return 1U;
  }
  return 1U;
}